

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.hpp
# Opt level: O1

iterator __thiscall
nestl::impl::vector<int,nestl::allocator<int>>::
insert_value<nestl::has_exceptions::exception_ptr_error,int>
          (vector<int,nestl::allocator<int>> *this,exception_ptr_error *err,const_iterator pos,
          int *args)

{
  const_iterator piVar1;
  long lVar2;
  iterator piVar3;
  long lVar4;
  void *pvVar5;
  iterator piVar6;
  iterator piVar7;
  iterator piVar8;
  iterator piVar9;
  
  piVar1 = *(const_iterator *)(this + 8);
  if (pos < piVar1) {
    __assert_fail("pos >= m_start",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/prograholic[P]nestl/nestl/implementation/vector.hpp"
                  ,0x2bd,
                  "typename vector<T, A>::iterator nestl::impl::vector<int>::insert_value(OperationError &, const_iterator, Args &&...) [T = int, Allocator = nestl::allocator<int>, OperationError = nestl::has_exceptions::exception_ptr_error, Args = <int>]"
                 );
  }
  if (*(const_iterator *)(this + 0x10) < pos) {
    __assert_fail("pos <= m_finish",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/prograholic[P]nestl/nestl/implementation/vector.hpp"
                  ,0x2be,
                  "typename vector<T, A>::iterator nestl::impl::vector<int>::insert_value(OperationError &, const_iterator, Args &&...) [T = int, Allocator = nestl::allocator<int>, OperationError = nestl::has_exceptions::exception_ptr_error, Args = <int>]"
                 );
  }
  if ((*(const_iterator *)(this + 0x18) == *(const_iterator *)(this + 0x10)) &&
     (vector<int,_nestl::allocator<int>_>::grow<nestl::has_exceptions::exception_ptr_error>
                ((vector<int,_nestl::allocator<int>_> *)this,err,
                 ((long)*(const_iterator *)(this + 0x18) - (long)piVar1 >> 2) + 1),
     (err->m_exception)._M_exception_object != (void *)0x0)) {
    piVar7 = *(iterator *)(this + 0x10);
  }
  else {
    lVar2 = *(long *)(this + 8);
    piVar3 = *(iterator *)(this + 0x10);
    lVar4 = *(long *)(this + 0x18);
    if ((iterator)(lVar4 - lVar2) <= (iterator)((long)piVar3 - lVar2)) {
      __assert_fail("capacity() > size()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/prograholic[P]nestl/nestl/implementation/vector.hpp"
                    ,0x2cb,
                    "typename vector<T, A>::iterator nestl::impl::vector<int>::insert_value(OperationError &, const_iterator, Args &&...) [T = int, Allocator = nestl::allocator<int>, OperationError = nestl::has_exceptions::exception_ptr_error, Args = <int>]"
                   );
    }
    piVar8 = (iterator)((long)pos + (lVar2 - (long)piVar1));
    pvVar5 = (err->m_exception)._M_exception_object;
    piVar6 = piVar3;
    do {
      piVar9 = piVar6;
      piVar7 = (iterator)(lVar4 - lVar2);
      if (piVar9 == piVar8) break;
      *piVar9 = piVar9[-1];
      piVar7 = piVar3;
      piVar6 = piVar9 + -1;
    } while (pvVar5 == (void *)0x0);
    if ((piVar9 == piVar8) &&
       (*piVar8 = *args, piVar7 = piVar3, (err->m_exception)._M_exception_object == (void *)0x0)) {
      *(iterator *)(this + 0x10) = piVar3 + 1;
      piVar7 = piVar8;
    }
  }
  return piVar7;
}

Assistant:

typename vector<T, A>::iterator
vector<T, A>::insert_value(OperationError& err, const_iterator pos, Args&& ... args) NESTL_NOEXCEPT_SPEC
{
    assert(pos >= m_start);
    assert(pos <= m_finish);

    /// we should calculate offset before possible reallocation
    size_t offset = pos - m_start;

    if (capacity() == size())
    {
        grow(err, capacity() + 1);
        if (err)
        {
            return end();
        }
    }
    assert(capacity() > size());

    value_type* last = m_finish;
    value_type* first = m_start + offset;
    for (value_type* val = last; val != first; --val)
    {
        value_type* oldLocation = val - 1;
        nestl::class_operations::construct(err, val, *oldLocation);
        if (err)
        {
            return end();
        }
        nestl::detail::destroy(oldLocation, val);
    }


	nestl::class_operations::construct(err, first, std::forward<Args>(args) ...);
    if (err)
    {
        return end();
    }

    ++m_finish;
    return first;
}